

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void lowbd_write_buffer_16xn_sse2(__m128i *in,uint8_t *output,int stride,int flipud,int height)

{
  int iVar1;
  undefined8 *puVar2;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long lVar4;
  longlong in_RDI;
  int iVar5;
  longlong in_R8;
  longlong in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i res1;
  __m128i pred;
  __m128i alVar6;
  __m128i u;
  __m128i v;
  int i;
  int step;
  int j;
  int local_6c;
  int local_48;
  int local_40;
  ulong uVar3;
  
  iVar5 = (int)in_R8;
  if (in_ECX == 0) {
    local_6c = 0;
  }
  else {
    local_6c = iVar5 + -1;
  }
  local_40 = local_6c;
  uVar3 = (ulong)in_ECX;
  iVar1 = 1;
  if (in_ECX != 0) {
    iVar1 = -1;
  }
  lVar4 = in_RSI;
  for (local_48 = 0; local_48 < iVar5; local_48 = local_48 + 1) {
    alVar6[1] = (long)(local_40 + iVar5) << 4;
    alVar6[0] = uVar3;
    res1[1] = in_R9;
    res1[0] = in_R8;
    pred[1] = lVar4;
    pred[0] = in_RDI;
    alVar6 = lowbd_get_recon_16x16_sse2(pred,alVar6,res1);
    uVar3 = alVar6[1];
    puVar2 = (undefined8 *)(in_RSI + local_48 * in_EDX);
    *puVar2 = extraout_XMM0_Qa;
    puVar2[1] = extraout_XMM0_Qb;
    local_40 = iVar1 + local_40;
  }
  return;
}

Assistant:

static inline void lowbd_write_buffer_16xn_sse2(__m128i *in, uint8_t *output,
                                                int stride, int flipud,
                                                int height) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  for (int i = 0; i < height; ++i, j += step) {
    __m128i v = _mm_loadu_si128((__m128i const *)(output + i * stride));
    __m128i u = lowbd_get_recon_16x16_sse2(v, in[j], in[j + height]);
    _mm_storeu_si128((__m128i *)(output + i * stride), u);
  }
}